

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.c
# Opt level: O0

ListNode * ListNext(LinkedList *list,ListNode *node)

{
  ListNode *node_local;
  LinkedList *list_local;
  
  if (list == (LinkedList *)0x0) {
    __assert_fail("list != NULL",".upnp/src/threadutil/LinkedList.c",0xf8,
                  "ListNode *ListNext(LinkedList *, ListNode *)");
  }
  if (node != (ListNode *)0x0) {
    if ((list == (LinkedList *)0x0) || (node == (ListNode *)0x0)) {
      list_local = (LinkedList *)0x0;
    }
    else if (node->next == &list->tail) {
      list_local = (LinkedList *)0x0;
    }
    else {
      list_local = (LinkedList *)node->next;
    }
    return &list_local->head;
  }
  __assert_fail("node != NULL",".upnp/src/threadutil/LinkedList.c",0xf9,
                "ListNode *ListNext(LinkedList *, ListNode *)");
}

Assistant:

ListNode *ListNext(LinkedList *list, ListNode *node)
{
	assert(list != NULL);
	assert(node != NULL);

	if (!list || !node)
		return NULL;
	if (node->next == &list->tail)
		return NULL;
	else
		return node->next;
}